

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

void __thiscall Assimp::StreamReader<true,_true>::SetPtr(StreamReader<true,_true> *this,int8_t *p)

{
  DeadlyImportError *this_00;
  allocator local_39;
  string local_38;
  int8_t *local_18;
  int8_t *p_local;
  StreamReader<true,_true> *this_local;
  
  this->current = p;
  if ((this->current <= this->limit) && (this->buffer <= this->current)) {
    return;
  }
  local_18 = p;
  p_local = (int8_t *)this;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,"End of file or read limit was reached",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void SetPtr(int8_t* p)  {
        current = p;
        if (current > limit || current < buffer) {
            throw DeadlyImportError("End of file or read limit was reached");
        }
    }